

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_> *
ExprEval::Operator::get_spec_table(void)

{
  time_t tVar1;
  int local_1314;
  Specification spec_shiftr;
  Specification spec_shiftl;
  Specification spec_not;
  Specification spec_or;
  Specification spec_pi;
  Specification spec_ln;
  Specification spec_mod;
  Specification spec_pow;
  Specification spec_divide;
  Specification spec_multiply;
  Specification spec_subtract;
  Specification spec_xor;
  Specification spec_false;
  Specification spec_true;
  Specification spec_e;
  Specification spec_rand;
  Specification spec_gamma;
  Specification spec_abs;
  Specification spec_ceil;
  Specification spec_floor;
  Specification spec_round;
  Specification spec_atanh;
  Specification spec_acosh;
  Specification spec_asinh;
  Specification spec_atan;
  Specification spec_acos;
  Specification spec_asin;
  Specification spec_tanh;
  Specification spec_cosh;
  Specification spec_sinh;
  Specification spec_cot;
  Specification spec_tan;
  Specification spec_cos;
  Specification spec_sin;
  Specification spec_log10;
  Specification spec_log2;
  Specification spec_and;
  Specification spec_add;
  
  if (specification_table ==
      (vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
       *)0x0) {
    tVar1 = time((time_t *)0x0);
    srand((uint)tVar1);
    specification_table =
         (vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
          *)operator_new(0x18);
    (specification_table->
    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (specification_table->
    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (specification_table->
    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_add.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_add.symbol._M_dataplus._M_p = (pointer)&spec_add.symbol.field_2;
    spec_add.symbol._M_string_length = 0;
    spec_add.symbol.field_2._M_local_buf[0] = '\0';
    spec_add.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_add.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_add.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_add.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_add.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_add.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_add.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_add.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_add.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_add.symbol);
    spec_add.priority = 9;
    spec_add.n_arg = 2;
    spec_subtract.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_add.arg_positions,(int *)&spec_subtract);
    spec_subtract.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_add.arg_positions,(int *)&spec_subtract);
    spec_subtract.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_subtract.symbol._M_dataplus._M_p = (pointer)&spec_subtract.symbol.field_2;
    spec_subtract.symbol._M_string_length = 0;
    spec_subtract.symbol.field_2._M_local_buf[0] = '\0';
    spec_subtract.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_subtract.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_subtract.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_subtract.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_subtract.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_subtract.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_subtract.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_subtract.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_subtract.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_subtract.symbol);
    spec_subtract.priority = 9;
    spec_subtract.n_arg = 2;
    spec_multiply.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_subtract.arg_positions,(int *)&spec_multiply);
    spec_multiply.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_subtract.arg_positions,(int *)&spec_multiply);
    spec_multiply.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_multiply.symbol._M_dataplus._M_p = (pointer)&spec_multiply.symbol.field_2;
    spec_multiply.symbol._M_string_length = 0;
    spec_multiply.symbol.field_2._M_local_buf[0] = '\0';
    spec_multiply.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_multiply.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_multiply.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_multiply.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_multiply.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_multiply.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_multiply.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_multiply.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_multiply.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_multiply.symbol);
    spec_multiply.priority = 8;
    spec_multiply.n_arg = 2;
    spec_divide.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_multiply.arg_positions,(int *)&spec_divide);
    spec_divide.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_multiply.arg_positions,(int *)&spec_divide);
    spec_divide.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_divide.symbol._M_dataplus._M_p = (pointer)&spec_divide.symbol.field_2;
    spec_divide.symbol._M_string_length = 0;
    spec_divide.symbol.field_2._M_local_buf[0] = '\0';
    spec_divide.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_divide.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_divide.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_divide.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_divide.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_divide.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_divide.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_divide.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_divide.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_divide.symbol);
    spec_divide.priority = 8;
    spec_divide.n_arg = 2;
    spec_pow.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_divide.arg_positions,(int *)&spec_pow);
    spec_pow.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_divide.arg_positions,(int *)&spec_pow);
    spec_pow.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_pow.symbol._M_dataplus._M_p = (pointer)&spec_pow.symbol.field_2;
    spec_pow.symbol._M_string_length = 0;
    spec_pow.symbol.field_2._M_local_buf[0] = '\0';
    spec_pow.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_pow.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_pow.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_pow.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_pow.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_pow.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_pow.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_pow.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_pow.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_pow.symbol);
    spec_pow.priority = 7;
    spec_pow.n_arg = 2;
    spec_mod.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_pow.arg_positions,(int *)&spec_mod);
    spec_mod.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_pow.arg_positions,(int *)&spec_mod);
    spec_mod.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_mod.symbol._M_dataplus._M_p = (pointer)&spec_mod.symbol.field_2;
    spec_mod.symbol._M_string_length = 0;
    spec_mod.symbol.field_2._M_local_buf[0] = '\0';
    spec_mod.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_mod.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_mod.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_mod.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_mod.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_mod.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_mod.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_mod.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_mod.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_mod.symbol);
    spec_mod.priority = 7;
    spec_mod.n_arg = 2;
    spec_ln.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_mod.arg_positions,(int *)&spec_ln);
    spec_ln.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_mod.arg_positions,(int *)&spec_ln);
    spec_ln.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_ln.symbol._M_dataplus._M_p = (pointer)&spec_ln.symbol.field_2;
    spec_ln.symbol._M_string_length = 0;
    spec_ln.symbol.field_2._M_local_buf[0] = '\0';
    spec_ln.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_ln.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_ln.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_ln.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_ln.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_ln.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_ln.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_ln.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_ln.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_ln.symbol);
    spec_ln.priority = 6;
    spec_ln.n_arg = 1;
    spec_log2.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_ln.arg_positions,(int *)&spec_log2);
    spec_log2.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_log2.symbol._M_dataplus._M_p = (pointer)&spec_log2.symbol.field_2;
    spec_log2.symbol._M_string_length = 0;
    spec_log2.symbol.field_2._M_local_buf[0] = '\0';
    spec_log2.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_log2.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_log2.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_log2.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_log2.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_log2.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_log2.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_log2.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_log2.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_log2.symbol);
    spec_log2.priority = 6;
    spec_log2.n_arg = 1;
    spec_log10.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_log2.arg_positions,(int *)&spec_log10);
    spec_log10.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_log10.symbol._M_dataplus._M_p = (pointer)&spec_log10.symbol.field_2;
    spec_log10.symbol._M_string_length = 0;
    spec_log10.symbol.field_2._M_local_buf[0] = '\0';
    spec_log10.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_log10.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_log10.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_log10.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_log10.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_log10.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_log10.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_log10.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_log10.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_log10.symbol);
    spec_log10.priority = 6;
    spec_log10.n_arg = 1;
    spec_sin.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_log10.arg_positions,(int *)&spec_sin);
    spec_sin.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_sin.symbol._M_dataplus._M_p = (pointer)&spec_sin.symbol.field_2;
    spec_sin.symbol._M_string_length = 0;
    spec_sin.symbol.field_2._M_local_buf[0] = '\0';
    spec_sin.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_sin.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_sin.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_sin.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_sin.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_sin.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_sin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_sin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_sin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_sin.symbol);
    spec_sin.priority = 6;
    spec_sin.n_arg = 1;
    spec_cos.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_sin.arg_positions,(int *)&spec_cos);
    spec_cos.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_cos.symbol._M_dataplus._M_p = (pointer)&spec_cos.symbol.field_2;
    spec_cos.symbol._M_string_length = 0;
    spec_cos.symbol.field_2._M_local_buf[0] = '\0';
    spec_cos.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cos.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cos.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_cos.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cos.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cos.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_cos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_cos.symbol);
    spec_cos.priority = 6;
    spec_cos.n_arg = 1;
    spec_tan.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_cos.arg_positions,(int *)&spec_tan);
    spec_tan.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_tan.symbol._M_dataplus._M_p = (pointer)&spec_tan.symbol.field_2;
    spec_tan.symbol._M_string_length = 0;
    spec_tan.symbol.field_2._M_local_buf[0] = '\0';
    spec_tan.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_tan.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_tan.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_tan.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_tan.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_tan.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_tan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_tan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_tan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_tan.symbol);
    spec_tan.priority = 6;
    spec_tan.n_arg = 1;
    spec_cot.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_tan.arg_positions,(int *)&spec_cot);
    spec_cot.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_cot.symbol._M_dataplus._M_p = (pointer)&spec_cot.symbol.field_2;
    spec_cot.symbol._M_string_length = 0;
    spec_cot.symbol.field_2._M_local_buf[0] = '\0';
    spec_cot.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cot.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cot.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_cot.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cot.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cot.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_cot.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cot.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cot.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_cot.symbol);
    spec_cot.priority = 6;
    spec_cot.n_arg = 1;
    spec_sinh.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_cot.arg_positions,(int *)&spec_sinh);
    spec_sinh.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_sinh.symbol._M_dataplus._M_p = (pointer)&spec_sinh.symbol.field_2;
    spec_sinh.symbol._M_string_length = 0;
    spec_sinh.symbol.field_2._M_local_buf[0] = '\0';
    spec_sinh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_sinh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_sinh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_sinh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_sinh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_sinh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_sinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_sinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_sinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_sinh.symbol);
    spec_sinh.priority = 6;
    spec_sinh.n_arg = 1;
    spec_cosh.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_sinh.arg_positions,(int *)&spec_cosh);
    spec_cosh.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_cosh.symbol._M_dataplus._M_p = (pointer)&spec_cosh.symbol.field_2;
    spec_cosh.symbol._M_string_length = 0;
    spec_cosh.symbol.field_2._M_local_buf[0] = '\0';
    spec_cosh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cosh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cosh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_cosh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cosh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cosh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_cosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_cosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_cosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_cosh.symbol);
    spec_cosh.priority = 6;
    spec_cosh.n_arg = 1;
    spec_tanh.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_cosh.arg_positions,(int *)&spec_tanh);
    spec_tanh.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_tanh.symbol._M_dataplus._M_p = (pointer)&spec_tanh.symbol.field_2;
    spec_tanh.symbol._M_string_length = 0;
    spec_tanh.symbol.field_2._M_local_buf[0] = '\0';
    spec_tanh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_tanh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_tanh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_tanh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_tanh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_tanh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_tanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_tanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_tanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_tanh.symbol);
    spec_tanh.priority = 6;
    spec_tanh.n_arg = 1;
    spec_asin.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_tanh.arg_positions,(int *)&spec_asin);
    spec_asin.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_asin.symbol._M_dataplus._M_p = (pointer)&spec_asin.symbol.field_2;
    spec_asin.symbol._M_string_length = 0;
    spec_asin.symbol.field_2._M_local_buf[0] = '\0';
    spec_asin.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_asin.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_asin.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_asin.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_asin.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_asin.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_asin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_asin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_asin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_asin.symbol);
    spec_asin.priority = 6;
    spec_asin.n_arg = 1;
    spec_acos.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_asin.arg_positions,(int *)&spec_acos);
    spec_acos.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_acos.symbol._M_dataplus._M_p = (pointer)&spec_acos.symbol.field_2;
    spec_acos.symbol._M_string_length = 0;
    spec_acos.symbol.field_2._M_local_buf[0] = '\0';
    spec_acos.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_acos.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_acos.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_acos.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_acos.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_acos.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_acos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_acos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_acos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_acos.symbol);
    spec_acos.priority = 6;
    spec_acos.n_arg = 1;
    spec_atan.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_acos.arg_positions,(int *)&spec_atan);
    spec_atan.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_atan.symbol._M_dataplus._M_p = (pointer)&spec_atan.symbol.field_2;
    spec_atan.symbol._M_string_length = 0;
    spec_atan.symbol.field_2._M_local_buf[0] = '\0';
    spec_atan.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_atan.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_atan.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_atan.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_atan.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_atan.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_atan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_atan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_atan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_atan.symbol);
    spec_atan.priority = 6;
    spec_atan.n_arg = 1;
    spec_asinh.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_atan.arg_positions,(int *)&spec_asinh);
    spec_asinh.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_asinh.symbol._M_dataplus._M_p = (pointer)&spec_asinh.symbol.field_2;
    spec_asinh.symbol._M_string_length = 0;
    spec_asinh.symbol.field_2._M_local_buf[0] = '\0';
    spec_asinh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_asinh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_asinh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_asinh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_asinh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_asinh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_asinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_asinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_asinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_asinh.symbol);
    spec_asinh.priority = 6;
    spec_asinh.n_arg = 1;
    spec_acosh.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_asinh.arg_positions,(int *)&spec_acosh);
    spec_acosh.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_acosh.symbol._M_dataplus._M_p = (pointer)&spec_acosh.symbol.field_2;
    spec_acosh.symbol._M_string_length = 0;
    spec_acosh.symbol.field_2._M_local_buf[0] = '\0';
    spec_acosh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_acosh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_acosh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_acosh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_acosh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_acosh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_acosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_acosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_acosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_acosh.symbol);
    spec_acosh.priority = 6;
    spec_acosh.n_arg = 1;
    spec_atanh.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_acosh.arg_positions,(int *)&spec_atanh);
    spec_atanh.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_atanh.symbol._M_dataplus._M_p = (pointer)&spec_atanh.symbol.field_2;
    spec_atanh.symbol._M_string_length = 0;
    spec_atanh.symbol.field_2._M_local_buf[0] = '\0';
    spec_atanh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_atanh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_atanh.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_atanh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_atanh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_atanh.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_atanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_atanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_atanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_atanh.symbol);
    spec_atanh.priority = 6;
    spec_atanh.n_arg = 1;
    spec_round.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_atanh.arg_positions,(int *)&spec_round);
    spec_round.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_round.symbol._M_dataplus._M_p = (pointer)&spec_round.symbol.field_2;
    spec_round.symbol._M_string_length = 0;
    spec_round.symbol.field_2._M_local_buf[0] = '\0';
    spec_round.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_round.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_round.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_round.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_round.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_round.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_round.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_round.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_round.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_round.symbol);
    spec_round.priority = 6;
    spec_round.n_arg = 1;
    spec_floor.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_round.arg_positions,(int *)&spec_floor);
    spec_floor.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_floor.symbol._M_dataplus._M_p = (pointer)&spec_floor.symbol.field_2;
    spec_floor.symbol._M_string_length = 0;
    spec_floor.symbol.field_2._M_local_buf[0] = '\0';
    spec_floor.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_floor.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_floor.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_floor.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_floor.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_floor.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_floor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_floor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_floor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_floor.symbol);
    spec_floor.priority = 6;
    spec_floor.n_arg = 1;
    spec_ceil.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_floor.arg_positions,(int *)&spec_ceil);
    spec_ceil.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_ceil.symbol._M_dataplus._M_p = (pointer)&spec_ceil.symbol.field_2;
    spec_ceil.symbol._M_string_length = 0;
    spec_ceil.symbol.field_2._M_local_buf[0] = '\0';
    spec_ceil.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_ceil.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_ceil.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_ceil.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_ceil.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_ceil.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_ceil.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_ceil.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_ceil.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_ceil.symbol);
    spec_ceil.priority = 6;
    spec_ceil.n_arg = 1;
    spec_abs.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_ceil.arg_positions,(int *)&spec_abs);
    spec_abs.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_abs.symbol._M_dataplus._M_p = (pointer)&spec_abs.symbol.field_2;
    spec_abs.symbol._M_string_length = 0;
    spec_abs.symbol.field_2._M_local_buf[0] = '\0';
    spec_abs.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_abs.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_abs.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_abs.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_abs.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_abs.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_abs.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_abs.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_abs.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_abs.symbol);
    spec_abs.priority = 6;
    spec_abs.n_arg = 1;
    spec_gamma.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_abs.arg_positions,(int *)&spec_gamma);
    spec_gamma.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_gamma.symbol._M_dataplus._M_p = (pointer)&spec_gamma.symbol.field_2;
    spec_gamma.symbol._M_string_length = 0;
    spec_gamma.symbol.field_2._M_local_buf[0] = '\0';
    spec_gamma.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_gamma.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_gamma.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_gamma.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_gamma.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_gamma.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_gamma.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_gamma.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_gamma.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_gamma.symbol);
    spec_gamma.priority = 6;
    spec_gamma.n_arg = 1;
    spec_rand.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_gamma.arg_positions,(int *)&spec_rand);
    spec_rand.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_rand.symbol._M_dataplus._M_p = (pointer)&spec_rand.symbol.field_2;
    spec_rand.symbol._M_string_length = 0;
    spec_rand.symbol.field_2._M_local_buf[0] = '\0';
    spec_rand.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_rand.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_rand.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_rand.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_rand.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_rand.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_rand.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_rand.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_rand.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_rand.symbol);
    spec_rand.priority = 6;
    spec_rand.n_arg = 0;
    spec_pi.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_rand.arg_positions,(int *)&spec_pi);
    spec_pi.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_pi.symbol._M_dataplus._M_p = (pointer)&spec_pi.symbol.field_2;
    spec_pi.symbol._M_string_length = 0;
    spec_pi.symbol.field_2._M_local_buf[0] = '\0';
    spec_pi.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_pi.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_pi.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_pi.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_pi.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_pi.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_pi.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_pi.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_pi.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_pi.symbol);
    spec_pi.priority = 5;
    spec_pi.n_arg = 0;
    spec_e.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_e.symbol._M_dataplus._M_p = (pointer)&spec_e.symbol.field_2;
    spec_e.symbol._M_string_length = 0;
    spec_e.symbol.field_2._M_local_buf[0] = '\0';
    spec_e.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_e.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_e.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_e.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_e.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_e.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_e.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_e.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_e.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_e.symbol);
    spec_e.priority = 5;
    spec_e.n_arg = 0;
    spec_true.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_true.symbol._M_dataplus._M_p = (pointer)&spec_true.symbol.field_2;
    spec_true.symbol._M_string_length = 0;
    spec_true.symbol.field_2._M_local_buf[0] = '\0';
    spec_true.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_true.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_true.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_true.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_true.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_true.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_true.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_true.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_true.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_true.symbol);
    spec_true.priority = 5;
    spec_true.n_arg = 0;
    spec_false.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_false.symbol._M_dataplus._M_p = (pointer)&spec_false.symbol.field_2;
    spec_false.symbol._M_string_length = 0;
    spec_false.symbol.field_2._M_local_buf[0] = '\0';
    spec_false.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_false.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_false.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_false.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_false.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_false.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_false.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_false.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_false.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_false.symbol);
    spec_false.priority = 5;
    spec_false.n_arg = 0;
    spec_and.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_and.symbol._M_dataplus._M_p = (pointer)&spec_and.symbol.field_2;
    spec_and.symbol._M_string_length = 0;
    spec_and.symbol.field_2._M_local_buf[0] = '\0';
    spec_and.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_and.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_and.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_and.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_and.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_and.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_and.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_and.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_and.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_and.symbol);
    spec_and.priority = 6;
    spec_and.n_arg = 2;
    spec_or.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_and.arg_positions,(int *)&spec_or);
    spec_or.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_and.arg_positions,(int *)&spec_or);
    spec_or.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_or.symbol._M_dataplus._M_p = (pointer)&spec_or.symbol.field_2;
    spec_or.symbol._M_string_length = 0;
    spec_or.symbol.field_2._M_local_buf[0] = '\0';
    spec_or.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_or.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_or.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_or.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_or.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_or.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_or.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_or.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_or.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_or.symbol);
    spec_or.priority = 6;
    spec_or.n_arg = 2;
    spec_not.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_or.arg_positions,(int *)&spec_not);
    spec_not.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_or.arg_positions,(int *)&spec_not);
    spec_not.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_not.symbol._M_dataplus._M_p = (pointer)&spec_not.symbol.field_2;
    spec_not.symbol._M_string_length = 0;
    spec_not.symbol.field_2._M_local_buf[0] = '\0';
    spec_not.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_not.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_not.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_not.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_not.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_not.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_not.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_not.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_not.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_not.symbol);
    spec_not.priority = 6;
    spec_not.n_arg = 1;
    spec_xor.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_not.arg_positions,(int *)&spec_xor);
    spec_xor.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_xor.symbol._M_dataplus._M_p = (pointer)&spec_xor.symbol.field_2;
    spec_xor.symbol._M_string_length = 0;
    spec_xor.symbol.field_2._M_local_buf[0] = '\0';
    spec_xor.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_xor.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_xor.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_xor.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_xor.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_xor.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_xor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_xor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_xor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_xor.symbol);
    spec_xor.priority = 6;
    spec_xor.n_arg = 2;
    spec_shiftl.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_xor.arg_positions,(int *)&spec_shiftl);
    spec_shiftl.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_xor.arg_positions,(int *)&spec_shiftl);
    spec_shiftl.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_shiftl.symbol._M_dataplus._M_p = (pointer)&spec_shiftl.symbol.field_2;
    spec_shiftl.symbol._M_string_length = 0;
    spec_shiftl.symbol.field_2._M_local_buf[0] = '\0';
    spec_shiftl.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_shiftl.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_shiftl.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_shiftl.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_shiftl.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_shiftl.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_shiftl.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_shiftl.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_shiftl.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_shiftl.symbol);
    spec_shiftl.priority = 6;
    spec_shiftl.n_arg = 2;
    spec_shiftr.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_shiftl.arg_positions,(int *)&spec_shiftr);
    spec_shiftr.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_shiftl.arg_positions,(int *)&spec_shiftr);
    spec_shiftr.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00114d50;
    spec_shiftr.symbol._M_dataplus._M_p = (pointer)&spec_shiftr.symbol.field_2;
    spec_shiftr.symbol._M_string_length = 0;
    spec_shiftr.symbol.field_2._M_local_buf[0] = '\0';
    spec_shiftr.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spec_shiftr.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_shiftr.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_shiftr.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_shiftr.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_shiftr.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec_shiftr.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec_shiftr.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec_shiftr.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::assign((char *)&spec_shiftr.symbol);
    spec_shiftr.priority = 6;
    spec_shiftr.n_arg = 2;
    local_1314 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_shiftr.arg_positions,&local_1314);
    local_1314 = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&spec_shiftr.arg_positions,&local_1314);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_add);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_subtract);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_multiply);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_divide);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_pow);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_mod);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_ln);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_log2);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_log10);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_sin);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_cos);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_tan);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_cot);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_sinh);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_cosh);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_tanh);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_asin);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_acos);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_atan);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_asinh);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_acosh);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_atanh);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_round);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_floor);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_ceil);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_abs);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_gamma);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_rand);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_pi);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_e);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_true);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_false);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_and);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_or);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_not);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_xor);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_shiftl);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&spec_shiftr);
    Specification::~Specification(&spec_shiftr);
    Specification::~Specification(&spec_shiftl);
    Specification::~Specification(&spec_xor);
    Specification::~Specification(&spec_not);
    Specification::~Specification(&spec_or);
    Specification::~Specification(&spec_and);
    Specification::~Specification(&spec_false);
    Specification::~Specification(&spec_true);
    Specification::~Specification(&spec_e);
    Specification::~Specification(&spec_pi);
    Specification::~Specification(&spec_rand);
    Specification::~Specification(&spec_gamma);
    Specification::~Specification(&spec_abs);
    Specification::~Specification(&spec_ceil);
    Specification::~Specification(&spec_floor);
    Specification::~Specification(&spec_round);
    Specification::~Specification(&spec_atanh);
    Specification::~Specification(&spec_acosh);
    Specification::~Specification(&spec_asinh);
    Specification::~Specification(&spec_atan);
    Specification::~Specification(&spec_acos);
    Specification::~Specification(&spec_asin);
    Specification::~Specification(&spec_tanh);
    Specification::~Specification(&spec_cosh);
    Specification::~Specification(&spec_sinh);
    Specification::~Specification(&spec_cot);
    Specification::~Specification(&spec_tan);
    Specification::~Specification(&spec_cos);
    Specification::~Specification(&spec_sin);
    Specification::~Specification(&spec_log10);
    Specification::~Specification(&spec_log2);
    Specification::~Specification(&spec_ln);
    Specification::~Specification(&spec_mod);
    Specification::~Specification(&spec_pow);
    Specification::~Specification(&spec_divide);
    Specification::~Specification(&spec_multiply);
    Specification::~Specification(&spec_subtract);
    Specification::~Specification(&spec_add);
  }
  return specification_table;
}

Assistant:

const std::vector<Operator::Specification>* get_spec_table(){
            if(!specification_table){
                srand(time(0));
                specification_table = new std::vector<Operator::Specification>;

                Operator::Specification spec_add;
                spec_add.symbol = "+";
                spec_add.priority = 9;
                spec_add.n_arg = 2;
                spec_add.arg_positions.push_back(-1);
                spec_add.arg_positions.push_back(1);

                Operator::Specification spec_subtract;
                spec_subtract.symbol = "-";
                spec_subtract.priority = 9;
                spec_subtract.n_arg = 2;
                spec_subtract.arg_positions.push_back(-1);
                spec_subtract.arg_positions.push_back(1);

                Operator::Specification spec_multiply;
                spec_multiply.symbol = "*";
                spec_multiply.priority = 8;
                spec_multiply.n_arg = 2;
                spec_multiply.arg_positions.push_back(-1);
                spec_multiply.arg_positions.push_back(1);

                Operator::Specification spec_divide;
                spec_divide.symbol = "/";
                spec_divide.priority = 8;
                spec_divide.n_arg = 2;
                spec_divide.arg_positions.push_back(-1);
                spec_divide.arg_positions.push_back(1);

                Operator::Specification spec_pow;
                spec_pow.symbol = "^";
                spec_pow.priority = 7;
                spec_pow.n_arg = 2;
                spec_pow.arg_positions.push_back(-1);
                spec_pow.arg_positions.push_back(1);

                Operator::Specification spec_mod;
                spec_mod.symbol = "mod";
                spec_mod.priority = 7;
                spec_mod.n_arg = 2;
                spec_mod.arg_positions.push_back(-1);
                spec_mod.arg_positions.push_back(1);

                Operator::Specification spec_ln;
                spec_ln.symbol = "ln";
                spec_ln.priority = 6;
                spec_ln.n_arg = 1;
                spec_ln.arg_positions.push_back(1);

                Operator::Specification spec_log2;
                spec_log2.symbol = "log2";
                spec_log2.priority = 6;
                spec_log2.n_arg = 1;
                spec_log2.arg_positions.push_back(1);

                Operator::Specification spec_log10;
                spec_log10.symbol = "log";
                spec_log10.priority = 6;
                spec_log10.n_arg = 1;
                spec_log10.arg_positions.push_back(1);

                Operator::Specification spec_sin;
                spec_sin.symbol = "sin";
                spec_sin.priority = 6;
                spec_sin.n_arg = 1;
                spec_sin.arg_positions.push_back(1);

                Operator::Specification spec_cos;
                spec_cos.symbol = "cos";
                spec_cos.priority = 6;
                spec_cos.n_arg = 1;
                spec_cos.arg_positions.push_back(1);

                Operator::Specification spec_tan;
                spec_tan.symbol = "tan";
                spec_tan.priority = 6;
                spec_tan.n_arg = 1;
                spec_tan.arg_positions.push_back(1);

                Operator::Specification spec_cot;
                spec_cot.symbol = "cot";
                spec_cot.priority = 6;
                spec_cot.n_arg = 1;
                spec_cot.arg_positions.push_back(1);

                Operator::Specification spec_sinh;
                spec_sinh.symbol = "sinh";
                spec_sinh.priority = 6;
                spec_sinh.n_arg = 1;
                spec_sinh.arg_positions.push_back(1);

                Operator::Specification spec_cosh;
                spec_cosh.symbol = "cosh";
                spec_cosh.priority = 6;
                spec_cosh.n_arg = 1;
                spec_cosh.arg_positions.push_back(1);

                Operator::Specification spec_tanh;
                spec_tanh.symbol = "tanh";
                spec_tanh.priority = 6;
                spec_tanh.n_arg = 1;
                spec_tanh.arg_positions.push_back(1);

                Operator::Specification spec_asin;
                spec_asin.symbol = "arcsin";
                spec_asin.priority = 6;
                spec_asin.n_arg = 1;
                spec_asin.arg_positions.push_back(1);

                Operator::Specification spec_acos;
                spec_acos.symbol = "arccos";
                spec_acos.priority = 6;
                spec_acos.n_arg = 1;
                spec_acos.arg_positions.push_back(1);

                Operator::Specification spec_atan;
                spec_atan.symbol = "arctan";
                spec_atan.priority = 6;
                spec_atan.n_arg = 1;
                spec_atan.arg_positions.push_back(1);

                Operator::Specification spec_asinh;
                spec_asinh.symbol = "arcsinh";
                spec_asinh.priority = 6;
                spec_asinh.n_arg = 1;
                spec_asinh.arg_positions.push_back(1);

                Operator::Specification spec_acosh;
                spec_acosh.symbol = "arccosh";
                spec_acosh.priority = 6;
                spec_acosh.n_arg = 1;
                spec_acosh.arg_positions.push_back(1);

                Operator::Specification spec_atanh;
                spec_atanh.symbol = "arctanh";
                spec_atanh.priority = 6;
                spec_atanh.n_arg = 1;
                spec_atanh.arg_positions.push_back(1);

                Operator::Specification spec_round;
                spec_round.symbol = "round";
                spec_round.priority = 6;
                spec_round.n_arg = 1;
                spec_round.arg_positions.push_back(1);

                Operator::Specification spec_floor;
                spec_floor.symbol = "floor";
                spec_floor.priority = 6;
                spec_floor.n_arg = 1;
                spec_floor.arg_positions.push_back(1);

                Operator::Specification spec_ceil;
                spec_ceil.symbol = "ceil";
                spec_ceil.priority = 6;
                spec_ceil.n_arg = 1;
                spec_ceil.arg_positions.push_back(1);

                Operator::Specification spec_abs;
                spec_abs.symbol = "abs";
                spec_abs.priority = 6;
                spec_abs.n_arg = 1;
                spec_abs.arg_positions.push_back(1);

                Operator::Specification spec_gamma;
                spec_gamma.symbol = "gamma";
                spec_gamma.priority = 6;
                spec_gamma.n_arg = 1;
                spec_gamma.arg_positions.push_back(1);

                Operator::Specification spec_rand;
                spec_rand.symbol = "rand";
                spec_rand.priority = 6;
                spec_rand.n_arg = 0;
                spec_rand.arg_positions.push_back(1);

                /* Math constants */
                Operator::Specification spec_pi;
                spec_pi.symbol = "pi";
                spec_pi.priority = 5;
                spec_pi.n_arg = 0;

                Operator::Specification spec_e;
                spec_e.symbol = "e";
                spec_e.priority = 5;
                spec_e.n_arg = 0;

                Operator::Specification spec_true;
                spec_true.symbol = "T";
                spec_true.priority = 5;
                spec_true.n_arg = 0;

                Operator::Specification spec_false;
                spec_false.symbol = "F";
                spec_false.priority = 5;
                spec_false.n_arg = 0;
                /* = = = = = = = = */

                Operator::Specification spec_and;
                spec_and.symbol = "and";
                spec_and.priority = 6;
                spec_and.n_arg = 2;
                spec_and.arg_positions.push_back(-1);
                spec_and.arg_positions.push_back(1);

                Operator::Specification spec_or;
                spec_or.symbol = "or";
                spec_or.priority = 6;
                spec_or.n_arg = 2;
                spec_or.arg_positions.push_back(-1);
                spec_or.arg_positions.push_back(1);

                Operator::Specification spec_not;
                spec_not.symbol = "not";
                spec_not.priority = 6;
                spec_not.n_arg = 1;
                spec_not.arg_positions.push_back(1);

                Operator::Specification spec_xor;
                spec_xor.symbol = "xor";
                spec_xor.priority = 6;
                spec_xor.n_arg = 2;
                spec_xor.arg_positions.push_back(-1);
                spec_xor.arg_positions.push_back(1);

                Operator::Specification spec_shiftl;
                spec_shiftl.symbol = "shiftl";
                spec_shiftl.priority = 6;
                spec_shiftl.n_arg = 2;
                spec_shiftl.arg_positions.push_back(-1);
                spec_shiftl.arg_positions.push_back(1);

                Operator::Specification spec_shiftr;
                spec_shiftr.symbol = "shiftr";
                spec_shiftr.priority = 6;
                spec_shiftr.n_arg = 2;
                spec_shiftr.arg_positions.push_back(-1);
                spec_shiftr.arg_positions.push_back(1);

                specification_table->push_back(spec_add);
                specification_table->push_back(spec_subtract);
                specification_table->push_back(spec_multiply);
                specification_table->push_back(spec_divide);
                specification_table->push_back(spec_pow);
                specification_table->push_back(spec_mod);

                specification_table->push_back(spec_ln);
                specification_table->push_back(spec_log2);
                specification_table->push_back(spec_log10);

                specification_table->push_back(spec_sin);
                specification_table->push_back(spec_cos);
                specification_table->push_back(spec_tan);
                specification_table->push_back(spec_cot);

                specification_table->push_back(spec_sinh);
                specification_table->push_back(spec_cosh);
                specification_table->push_back(spec_tanh);
                // specification_table->push_back(spec_coth);

                specification_table->push_back(spec_asin);
                specification_table->push_back(spec_acos);
                specification_table->push_back(spec_atan);
                // specification_table->push_back(spec_acot);

                specification_table->push_back(spec_asinh);
                specification_table->push_back(spec_acosh);
                specification_table->push_back(spec_atanh);
                // specification_table->push_back(spec_acoth);

                specification_table->push_back(spec_round);
                specification_table->push_back(spec_floor);
                specification_table->push_back(spec_ceil);
                specification_table->push_back(spec_abs);
                specification_table->push_back(spec_gamma);
                specification_table->push_back(spec_rand);

                specification_table->push_back(spec_pi);
                specification_table->push_back(spec_e);
                specification_table->push_back(spec_true);
                specification_table->push_back(spec_false);

                specification_table->push_back(spec_and);
                specification_table->push_back(spec_or);
                specification_table->push_back(spec_not);
                specification_table->push_back(spec_xor);
                specification_table->push_back(spec_shiftl);
                specification_table->push_back(spec_shiftr);
            }
            return specification_table;
        }